

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationDataBuilder::getSingleCE
          (CollationDataBuilder *this,UChar32 c,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t iVar3;
  bool fromBase_00;
  uint32_t local_64;
  int64_t local_58;
  uint32_t local_4c;
  int32_t i_1;
  int32_t i;
  uint32_t ce32;
  UBool fromBase;
  UErrorCode *errorCode_local;
  UChar32 c_local;
  CollationDataBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  i_1 = utrie2_get32_63(this->trie,c);
  fromBase_00 = i_1 == 0xc0;
  if (fromBase_00) {
    i_1 = CollationData::getCE32(this->base,c);
  }
  do {
    UVar1 = Collation::isSpecialCE32(i_1);
    if (UVar1 == '\0') {
      iVar3 = Collation::ceFromSimpleCE32(i_1);
      return iVar3;
    }
    iVar2 = Collation::tagFromCE32(i_1);
    switch(iVar2) {
    case 0:
    case 3:
      *errorCode = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    case 1:
      iVar3 = Collation::ceFromLongPrimaryCE32(i_1);
      return iVar3;
    case 2:
      iVar3 = Collation::ceFromLongSecondaryCE32(i_1);
      return iVar3;
    case 4:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xd:
      *errorCode = U_UNSUPPORTED_ERROR;
      return 0;
    case 5:
      iVar2 = Collation::lengthFromCE32(i_1);
      if (iVar2 != 1) {
        *errorCode = U_UNSUPPORTED_ERROR;
        return 0;
      }
      iVar2 = Collation::indexFromCE32(i_1);
      if (fromBase_00) {
        local_4c = this->base->ce32s[iVar2];
      }
      else {
        local_4c = UVector32::elementAti(&this->ce32s,iVar2);
      }
      i_1 = local_4c;
      break;
    case 6:
      iVar2 = Collation::lengthFromCE32(i_1);
      if (iVar2 == 1) {
        iVar2 = Collation::indexFromCE32(i_1);
        if (fromBase_00) {
          local_58 = this->base->ces[iVar2];
        }
        else {
          local_58 = UVector64::elementAti(&this->ce64s,iVar2);
        }
        return local_58;
      }
      *errorCode = U_UNSUPPORTED_ERROR;
      return 0;
    case 10:
      iVar2 = Collation::indexFromCE32(i_1);
      i_1 = UVector32::elementAti(&this->ce32s,iVar2);
      break;
    case 0xb:
      if (fromBase_00) {
        local_64 = *this->base->ce32s;
      }
      else {
        local_64 = UVector32::elementAti(&this->ce32s,0);
      }
      i_1 = local_64;
      break;
    case 0xe:
      i_1 = getCE32FromOffsetCE32(this,fromBase_00,c,i_1);
      break;
    case 0xf:
      iVar3 = Collation::unassignedCEFromCodePoint(c);
      return iVar3;
    }
  } while( true );
}

Assistant:

int64_t
CollationDataBuilder::getSingleCE(UChar32 c, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    // Keep parallel with CollationData::getSingleCE().
    UBool fromBase = FALSE;
    uint32_t ce32 = utrie2_get32(trie, c);
    if(ce32 == Collation::FALLBACK_CE32) {
        fromBase = TRUE;
        ce32 = base->getCE32(c);
    }
    while(Collation::isSpecialCE32(ce32)) {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::LATIN_EXPANSION_TAG:
        case Collation::BUILDER_DATA_TAG:
        case Collation::PREFIX_TAG:
        case Collation::CONTRACTION_TAG:
        case Collation::HANGUL_TAG:
        case Collation::LEAD_SURROGATE_TAG:
            errorCode = U_UNSUPPORTED_ERROR;
            return 0;
        case Collation::FALLBACK_TAG:
        case Collation::RESERVED_TAG_3:
            errorCode = U_INTERNAL_PROGRAM_ERROR;
            return 0;
        case Collation::LONG_PRIMARY_TAG:
            return Collation::ceFromLongPrimaryCE32(ce32);
        case Collation::LONG_SECONDARY_TAG:
            return Collation::ceFromLongSecondaryCE32(ce32);
        case Collation::EXPANSION32_TAG:
            if(Collation::lengthFromCE32(ce32) == 1) {
                int32_t i = Collation::indexFromCE32(ce32);
                ce32 = fromBase ? base->ce32s[i] : ce32s.elementAti(i);
                break;
            } else {
                errorCode = U_UNSUPPORTED_ERROR;
                return 0;
            }
        case Collation::EXPANSION_TAG: {
            if(Collation::lengthFromCE32(ce32) == 1) {
                int32_t i = Collation::indexFromCE32(ce32);
                return fromBase ? base->ces[i] : ce64s.elementAti(i);
            } else {
                errorCode = U_UNSUPPORTED_ERROR;
                return 0;
            }
        }
        case Collation::DIGIT_TAG:
            // Fetch the non-numeric-collation CE32 and continue.
            ce32 = ce32s.elementAti(Collation::indexFromCE32(ce32));
            break;
        case Collation::U0000_TAG:
            U_ASSERT(c == 0);
            // Fetch the normal ce32 for U+0000 and continue.
            ce32 = fromBase ? base->ce32s[0] : ce32s.elementAti(0);
            break;
        case Collation::OFFSET_TAG:
            ce32 = getCE32FromOffsetCE32(fromBase, c, ce32);
            break;
        case Collation::IMPLICIT_TAG:
            return Collation::unassignedCEFromCodePoint(c);
        }
    }
    return Collation::ceFromSimpleCE32(ce32);
}